

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g2d.c
# Opt level: O2

void g2d_polygon_closest_boundary_point(zarray_t *poly,double *q,double *p)

{
  int iVar1;
  int iVar2;
  int idx;
  double dVar3;
  double *p1;
  double *p0;
  double thisp [2];
  g2d_line_segment_t seg;
  double local_98;
  double *local_88;
  double *local_80;
  double local_78;
  double dStack_70;
  g2d_line_segment_t local_60;
  
  iVar1 = zarray_size(poly);
  idx = 0;
  iVar2 = iVar1;
  if (iVar1 < 1) {
    iVar2 = 0;
  }
  local_98 = INFINITY;
  while (iVar2 != idx) {
    zarray_get_volatile(poly,idx,&local_80);
    idx = idx + 1;
    zarray_get_volatile(poly,idx % iVar1,&local_88);
    g2d_line_segment_init_from_points(&local_60,local_80,local_88);
    g2d_line_segment_closest_point(&local_60,q,&local_78);
    dVar3 = g2d_distance(q,&local_78);
    if (dVar3 < local_98) {
      *p = local_78;
      p[1] = dStack_70;
      local_98 = dVar3;
    }
  }
  return;
}

Assistant:

void g2d_polygon_closest_boundary_point(const zarray_t *poly, const double q[2], double *p)
{
    int psz = zarray_size(poly);
    double min_dist = HUGE_VALF;

    for (int i = 0; i < psz; i++) {
        double *p0, *p1;

        zarray_get_volatile(poly, i, &p0);
        zarray_get_volatile(poly, (i+1) % psz, &p1);

        g2d_line_segment_t seg;
        g2d_line_segment_init_from_points(&seg, p0, p1);

        double thisp[2];
        g2d_line_segment_closest_point(&seg, q, thisp);

        double dist = g2d_distance(q, thisp);
        if (dist < min_dist) {
            memcpy(p, thisp, sizeof(double[2]));
            min_dist = dist;
        }
    }
}